

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client_sample.c
# Opt level: O0

void OnOperationComplete(MQTT_CLIENT_HANDLE handle,MQTT_CLIENT_EVENT_RESULT actionResult,
                        void *msgInfo,void *callbackCtx)

{
  char *topicName;
  uint16_t uVar1;
  char *appMsg;
  int iVar2;
  size_t appMsgLength;
  MQTT_MESSAGE_HANDLE msgHandle;
  MQTT_MESSAGE_HANDLE msg;
  SUBSCRIBE_PAYLOAD subscribe [2];
  void *callbackCtx_local;
  void *msgInfo_local;
  MQTT_CLIENT_EVENT_RESULT actionResult_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  appMsg = APP_NAME_A;
  uVar1 = PACKET_ID_VALUE;
  topicName = TOPIC_NAME_A;
  subscribe[1]._8_8_ = callbackCtx;
  switch(actionResult) {
  case MQTT_CLIENT_ON_CONNACK:
    printf("ConnAck function called\r\n");
    uVar1 = PACKET_ID_VALUE;
    msg = (MQTT_MESSAGE_HANDLE)TOPIC_NAME_A;
    subscribe[0].subscribeTopic._0_4_ = 0;
    subscribe[0]._8_8_ = TOPIC_NAME_B;
    subscribe[1].subscribeTopic._0_4_ = 2;
    PACKET_ID_VALUE = PACKET_ID_VALUE + 1;
    iVar2 = mqtt_client_subscribe(handle,uVar1,(SUBSCRIBE_PAYLOAD *)&msg,2);
    if (iVar2 != 0) {
      printf("%d: mqtt_client_subscribe failed\r\n",0x4f);
      g_continue = false;
    }
    break;
  case MQTT_CLIENT_ON_PUBLISH_ACK:
    break;
  case MQTT_CLIENT_ON_PUBLISH_RECV:
    break;
  case MQTT_CLIENT_ON_PUBLISH_REL:
    break;
  case MQTT_CLIENT_ON_PUBLISH_COMP:
    mqtt_client_disconnect(handle,(ON_MQTT_DISCONNECTED_CALLBACK)0x0,(void *)0x0);
    break;
  case MQTT_CLIENT_ON_SUBSCRIBE_ACK:
    PACKET_ID_VALUE = PACKET_ID_VALUE + 1;
    appMsgLength = strlen(APP_NAME_A);
    msgHandle = mqttmessage_create(uVar1,topicName,DELIVER_EXACTLY_ONCE,(uint8_t *)appMsg,
                                   appMsgLength);
    if (msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
      printf("%d: mqttmessage_create failed\r\n",0x59);
      g_continue = false;
    }
    else {
      iVar2 = mqtt_client_publish(handle,msgHandle);
      if (iVar2 != 0) {
        printf("%d: mqtt_client_publish failed\r\n",0x60);
        g_continue = false;
      }
      mqttmessage_destroy(msgHandle);
    }
    break;
  case MQTT_CLIENT_ON_UNSUBSCRIBE_ACK:
    break;
  case MQTT_CLIENT_ON_PING_RESPONSE:
    break;
  case MQTT_CLIENT_ON_DISCONNECT:
    g_continue = false;
    break;
  default:
    printf("unexpected value received for enumeration (%d)\n",(ulong)actionResult);
  }
  return;
}

Assistant:

static void OnOperationComplete(MQTT_CLIENT_HANDLE handle, MQTT_CLIENT_EVENT_RESULT actionResult, const void* msgInfo, void* callbackCtx)
{
    (void)msgInfo;
    (void)callbackCtx;
    switch (actionResult)
    {
        case MQTT_CLIENT_ON_CONNACK:
        {
            (void)printf("ConnAck function called\r\n");

            SUBSCRIBE_PAYLOAD subscribe[2];
            subscribe[0].subscribeTopic = TOPIC_NAME_A;
            subscribe[0].qosReturn = DELIVER_AT_MOST_ONCE;
            subscribe[1].subscribeTopic = TOPIC_NAME_B;
            subscribe[1].qosReturn = DELIVER_EXACTLY_ONCE;

            if (mqtt_client_subscribe(handle, PACKET_ID_VALUE++, subscribe, sizeof(subscribe) / sizeof(subscribe[0])) != 0)
            {
                (void)printf("%d: mqtt_client_subscribe failed\r\n", __LINE__);
                g_continue = false;
            }
            break;
        }
        case MQTT_CLIENT_ON_SUBSCRIBE_ACK:
        {
            MQTT_MESSAGE_HANDLE msg = mqttmessage_create(PACKET_ID_VALUE++, TOPIC_NAME_A, DELIVER_EXACTLY_ONCE, (const uint8_t*)APP_NAME_A, strlen(APP_NAME_A));
            if (msg == NULL)
            {
                (void)printf("%d: mqttmessage_create failed\r\n", __LINE__);
                g_continue = false;
            }
            else
            {
                if (mqtt_client_publish(handle, msg))
                {
                    (void)printf("%d: mqtt_client_publish failed\r\n", __LINE__);
                    g_continue = false;
                }
                mqttmessage_destroy(msg);
            }
            // Now send a message that will get
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_ACK:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_RECV:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_REL:
        {
            break;
        }
        case MQTT_CLIENT_ON_PUBLISH_COMP:
        {
            // Done so send disconnect
            mqtt_client_disconnect(handle, NULL, NULL);
            break;
        }
        case MQTT_CLIENT_ON_DISCONNECT:
            g_continue = false;
            break;
        case MQTT_CLIENT_ON_UNSUBSCRIBE_ACK:
        {
            break;
        }
        case MQTT_CLIENT_ON_PING_RESPONSE:
            break;
        default:
        {
            (void)printf("unexpected value received for enumeration (%d)\n", (int)actionResult);
        }
    }
}